

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O2

int lclear(lua_State *L)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  void *__ptr;
  
  piVar3 = (int *)lua_touserdata(L,1);
  if (piVar3 != (int *)0x0) {
    for (lVar5 = 0; lVar5 != 0x1000; lVar5 = lVar5 + 1) {
      __ptr = *(void **)(piVar3 + lVar5 * 2 + 4);
      while (__ptr != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        pvVar1 = *(void **)((long)__ptr + 0x10);
        free(__ptr);
        __ptr = pvVar1;
      }
      (piVar3 + lVar5 * 2 + 4)[0] = 0;
      (piVar3 + lVar5 * 2 + 4)[1] = 0;
    }
    iVar4 = piVar3[1];
    iVar2 = piVar3[2];
    if (iVar2 < iVar4) {
      iVar2 = iVar2 + *piVar3;
      piVar3[2] = iVar2;
    }
    for (; iVar4 < iVar2; iVar4 = iVar4 + 1) {
      free(*(void **)(piVar3 + (long)(iVar4 % *piVar3) * 4 + 0x2006));
      iVar2 = piVar3[2];
    }
    piVar3[1] = 0;
    piVar3[2] = 0;
  }
  return 0;
}

Assistant:

static int
lclear(lua_State *L) {
	struct queue * q = lua_touserdata(L, 1);
	if (q == NULL) {
		return 0;
	}
	int i;
	for (i=0;i<HASHSIZE;i++) {
		clear_list(q->hash[i]);
		q->hash[i] = NULL;
	}
	if (q->head > q->tail) {
		q->tail += q->cap;
	}
	for (i=q->head;i<q->tail;i++) {
		struct netpack *np = &q->queue[i % q->cap];
		skynet_free(np->buffer);
	}
	q->head = q->tail = 0;

	return 0;
}